

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera2png.c
# Opt level: O2

int main(void)

{
  _Bool _Var1;
  plutosvg_document_t *document;
  plutovg_surface_t *surface;
  char *__ptr;
  size_t sStackY_30;
  
  fwrite("Loading \'camera.svg\'\n",0x15,1,_stdout);
  document = plutosvg_document_load_from_file("camera.svg",-1.0,-1.0);
  if (document == (plutosvg_document_t *)0x0) {
    __ptr = "Unable to load \'camera.svg\'\n";
    sStackY_30 = 0x1c;
  }
  else {
    fwrite("Rendering \'camera.svg\'\n",0x17,1,_stdout);
    surface = plutosvg_document_render_to_surface
                        (document,(char *)0x0,-1,-1,(plutovg_color_t *)0x0,
                         (plutosvg_palette_func_t)0x0,(void *)0x0);
    if (surface != (plutovg_surface_t *)0x0) {
      fwrite("Writing \'camera.png\'\n",0x15,1,_stdout);
      _Var1 = plutovg_surface_write_to_png(surface,"camera.png");
      if (!_Var1) {
        fwrite("Unable to write \'camera.png\'\n",0x1d,1,_stderr);
      }
      goto LAB_0010344f;
    }
    __ptr = "Unable to render \'camera.svg\'\n";
    sStackY_30 = 0x1e;
  }
  fwrite(__ptr,sStackY_30,1,_stderr);
  surface = (plutovg_surface_t *)0x0;
LAB_0010344f:
  plutovg_surface_destroy(surface);
  plutosvg_document_destroy(document);
  return 0;
}

Assistant:

int main(void)
{
    plutosvg_document_t* document = NULL;
    plutovg_surface_t* surface = NULL;

    fprintf(stdout, "Loading 'camera.svg'\n");
    document = plutosvg_document_load_from_file("camera.svg", -1, -1);
    if(document == NULL) {
        fprintf(stderr, "Unable to load 'camera.svg'\n");
        goto cleanup;
    }

    fprintf(stdout, "Rendering 'camera.svg'\n");
    surface = plutosvg_document_render_to_surface(document, NULL, -1, -1, NULL, NULL, NULL);
    if(surface == NULL) {
        fprintf(stderr, "Unable to render 'camera.svg'\n");
        goto cleanup;
    }

    fprintf(stdout, "Writing 'camera.png'\n");
    if(!plutovg_surface_write_to_png(surface, "camera.png")) {
        fprintf(stderr, "Unable to write 'camera.png'\n");
        goto cleanup;
    }

cleanup:
    plutovg_surface_destroy(surface);
    plutosvg_document_destroy(document);
    return 0;
}